

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

string * __thiscall
pbrt::ZSobolSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,ZSobolSampler *this)

{
  int *unaff_RBX;
  
  StringPrintf<pbrt::RandomizeStrategy_const&,int_const&,int_const&,int_const&,unsigned_long_const&,int_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ ZSobolSampler randomizeStrategy: %s log2SamplesPerPixel: %d  seed: %d nBase4Digits: %d mortonIndex: %d dimension: %d ]"
             ,(char *)this,(RandomizeStrategy *)&this->log2SamplesPerPixel,&this->seed,
             &this->nBase4Digits,(int *)&this->mortonIndex,(unsigned_long *)&this->dimension,
             unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string ZSobolSampler::ToString() const {
    return StringPrintf("[ ZSobolSampler randomizeStrategy: %s log2SamplesPerPixel: %d "
                        " seed: %d nBase4Digits: %d mortonIndex: %d dimension: %d ]",
                        randomizeStrategy, log2SamplesPerPixel, seed, nBase4Digits,
                        mortonIndex, dimension);
}